

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  string *target_00;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference source;
  cmOutputConverter *this_00;
  string local_220;
  allocator local_1f9;
  string local_1f8 [8];
  string flg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  const_iterator idi;
  string local_1b8;
  undefined1 local_198 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_178;
  char *local_158;
  char *modpath_flag;
  string local_148 [8];
  string modflag;
  string local_120;
  char *local_100;
  char *moddir_flag;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string mod_dir;
  allocator local_59;
  string local_58;
  char *local_38;
  char *modout_flag;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalCommonGenerator *this_local;
  string *flags;
  
  modout_flag._7_1_ = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalCommonGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_Fortran_MODOUT_FLAG",&local_59);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(this,__return_storage_ptr__,pcVar3);
  }
  cmGeneratorTarget::GetFortranModuleDirectory
            ((string *)local_90,(cmGeneratorTarget *)config_local,&this->WorkingDirectory);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_00 = &(this->super_cmLocalGenerator).super_cmOutputConverter;
    cmOutputConverter::ConvertToRelativePath
              (&local_d0,this_00,&this->WorkingDirectory,(string *)local_90);
    cmOutputConverter::ConvertToOutputFormat(&local_b0,this_00,&local_d0,SHELL);
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f0,"CMAKE_Fortran_MODDIR_DEFAULT",
               (allocator *)((long)&moddir_flag + 7));
    pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
    std::__cxx11::string::operator=((string *)local_90,pcVar3);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&moddir_flag + 7));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_120,"CMAKE_Fortran_MODDIR_FLAG",
               (allocator *)(modflag.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
    local_100 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,pcVar3,(allocator *)((long)&modpath_flag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&modpath_flag + 7));
    std::__cxx11::string::operator+=(local_148,(string *)local_90);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,local_148);
    std::__cxx11::string::~string(local_148);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"CMAKE_Fortran_MODPATH_FLAG",
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_158 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_198);
    target_00 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"C",(allocator *)((long)&idi._M_current + 7));
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_198,(cmGeneratorTarget *)target_00,&local_1b8,local_28,true);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&idi._M_current + 7));
    local_1d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_198);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1c8,&local_1d0);
    while( true ) {
      flg.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_198);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1c8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&flg.field_2 + 8));
      pcVar3 = local_158;
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,pcVar3,&local_1f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      source = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1c8);
      cmOutputConverter::ConvertToOutputFormat
                (&local_220,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::operator+=(local_1f8,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198);
  }
  modout_flag._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_90);
  if ((modout_flag._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  if (const char* modout_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG")) {
    this->AppendFlags(flags, modout_flag);
  }

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->WorkingDirectory);
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->ConvertToRelativePath(this->WorkingDirectory, mod_dir),
      cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    const char* moddir_flag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    std::string modflag = moddir_flag;
    modflag += mod_dir;
    this->AppendFlags(flags, modflag);
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (const char* modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::vector<std::string>::const_iterator idi = includes.begin();
         idi != includes.end(); ++idi) {
      std::string flg = modpath_flag;
      flg += this->ConvertToOutputFormat(*idi, cmOutputConverter::SHELL);
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}